

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  pointer pPVar1;
  SectionNode *sectionNode;
  string className;
  allocator local_59;
  string local_58;
  string local_38;
  
  pPVar1 = (testCaseNode->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(testCaseNode->children).
            super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 == 8) {
    sectionNode = pPVar1->m_p;
    std::__cxx11::string::string
              ((string *)&local_58,(string *)&(testCaseNode->value).testInfo.className);
    if ((local_58._M_string_length == 0) &&
       ((sectionNode->childSections).
        super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (sectionNode->childSections).
        super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::assign((char *)&local_58);
    }
    std::__cxx11::string::string((string *)&local_38,"",&local_59);
    writeSection(this,&local_58,&local_38,sectionNode);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    return;
  }
  __assert_fail("testCaseNode.children.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nopppers[P]03-lambda-stuff/lib/catch.hpp"
                ,0x24de,"void Catch::JunitReporter::writeTestCase(const TestCaseNode &)");
}

Assistant:

virtual Ptr<Matcher<ExpressionT> > clone() const {
            return Ptr<Matcher<ExpressionT> >( new DerivedT( static_cast<DerivedT const&>( *this ) ) );
        }